

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O2

double __thiscall
imrt::IntensityILS::iLocalSearch(IntensityILS *this,Plan *P,double max_time,bool verbose)

{
  double *pdVar1;
  uint i;
  int j;
  pointer ppVar2;
  int iVar3;
  Station *this_00;
  _List_node_base *this_01;
  ostream *poVar4;
  Station *s;
  pointer ppVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double local_a0;
  double local_88;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> cells;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  
  this_00 = (Station *)Plan::get_stations_abi_cxx11_(P);
  this_01 = (_List_node_base *)&stations;
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)this_01,
             (list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)this_00);
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&diff;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node._M_size = 0;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  Plan::getEvaluation(P);
  do {
    this_01 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)&this_01->_M_next)
              ->_M_impl)._M_node.super__List_node_base._M_next;
    if (this_01 == (_List_node_base *)&stations) break;
    s = (Station *)this_01[1]._M_next;
    getShuffledCells(&cells,(IntensityILS *)this_00,s);
    ppVar2 = cells.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (ppVar5 = cells.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
      i = ppVar5->first;
      j = ppVar5->second;
      iVar3 = rand();
      for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
        dVar7 = (s->I).p[(int)i][j];
        if (iVar3 % 2 == iVar6) {
          this_00 = (Station *)(ulong)i;
          local_a0 = Station::intensityUp(s,i,j);
        }
        else {
          this_00 = (Station *)(ulong)i;
          local_a0 = Station::intensityDown(s,i,j);
        }
        pdVar1 = (s->I).p[(int)i] + j;
        if ((local_a0 != *pdVar1) || (NAN(local_a0) || NAN(*pdVar1))) {
          dVar7 = local_a0 - dVar7;
          this_00 = s;
          dVar8 = Plan::get_delta_eval(P,s,i,j,dVar7,999999);
          if (dVar8 < -0.05) {
            poVar4 = std::ostream::_M_insert<double>(dVar8);
            std::operator<<(poVar4,":");
            poVar4 = std::ostream::_M_insert<double>(dVar7);
            std::endl<char,std::char_traits<char>>(poVar4);
            Station::change_intensity
                      (s,i,j,local_a0,
                       (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x0
                      );
            local_88 = Plan::incremental_eval(P,s,i,j,dVar7);
            this_00 = s;
            goto LAB_0011eafc;
          }
        }
      }
    }
LAB_0011eafc:
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&cells.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              );
  } while (ppVar5 == ppVar2);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
  ;
  std::__cxx11::_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>::_M_clear
            (&stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>);
  return local_88;
}

Assistant:

double IntensityILS::iLocalSearch(Plan& P, double max_time, bool verbose){
		 const list<Station*> stations=P.get_stations();
		 list< pair< int, double > > diff;
		 double eval =P.getEvaluation();

		 for(auto s:stations){
			  vector < pair<int, int> > cells = getShuffledCells(s);
				for(auto cell:cells){
					int a=rand()%2;
					for(int b=0; b<2;b++){
					  int i=cell.first, j=cell.second;
            double intensity, old=s->I(i,j);
						if(a==b) intensity=s->intensityUp(i,j);
						else intensity=s->intensityDown(i,j);
						if(intensity==s->I(i,j)) continue;
            double delta_eval = P.get_delta_eval (*s, i, j, intensity-old);

						if(delta_eval<-0.05){
              cout << delta_eval << ":" << intensity-old << endl;
              //cout << P.getEvaluationFunction()->get_impact_beamlet(s->getAngle(),s->pos2beam[make_pair(i,j)]) << endl;
              s->change_intensity(i, j, intensity);
              return P.incremental_eval(*s, i, j, intensity-old);
            }

					}
				}
		 }
	 }